

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ReservoirQuantileBindData::Deserialize
          (Deserializer *deserializer,AggregateFunction *function)

{
  int iVar1;
  pointer pRVar2;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::ReservoirQuantileBindData_*,_false> local_20;
  
  local_20._M_head_impl = (ReservoirQuantileBindData *)operator_new(0x28);
  ((local_20._M_head_impl)->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__ReservoirQuantileBindData_02480b30;
  ((local_20._M_head_impl)->quantiles).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ((local_20._M_head_impl)->quantiles).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ((local_20._M_head_impl)->quantiles).super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pRVar2 = unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::vector<double,true>>
            ((Deserializer *)function,100,"quantiles",&pRVar2->quantiles);
  pRVar2 = unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
           ::operator->((unique_ptr<duckdb::ReservoirQuantileBindData,_std::default_delete<duckdb::ReservoirQuantileBindData>,_true>
                         *)&local_20);
  (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[2])
            (function,0x65,"sample_size");
  iVar1 = (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
            [0x15])(function);
  pRVar2->sample_size = CONCAT44(extraout_var,iVar1);
  (*(function->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[3])
            (function);
  deserializer->_vptr_Deserializer = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto result = make_uniq<ReservoirQuantileBindData>();
		deserializer.ReadProperty(100, "quantiles", result->quantiles);
		deserializer.ReadProperty(101, "sample_size", result->sample_size);
		return std::move(result);
	}